

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisetTest.cpp
# Opt level: O3

void print<ft::multiset<int,ft::greater<int>,ft::allocator<int>>>
               (multiset<int,_ft::greater<int>,_ft::allocator<int>_> *t,char *s)

{
  treeNode<int> *ptVar1;
  long lVar2;
  treeNode<int> *ptVar3;
  undefined8 in_RAX;
  size_t sVar4;
  ostream *this;
  treeNode<int> *ptVar5;
  treeNode<int> *ptVar6;
  bool bVar7;
  undefined8 uStack_38;
  
  lVar2 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar2 + -0x18) + 0x10f0b8);
  }
  else {
    sVar4 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  ptVar5 = ((t->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
            super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.m_first)->
           parent;
  if (ptVar5 != (t->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
                super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.m_last)
  {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      this = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      std::ostream::operator<<(this,ptVar5->value);
      ptVar1 = (t->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
               super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.NIL;
      ptVar3 = ptVar5->right;
      ptVar6 = ptVar5;
      if (ptVar5->right == ptVar1) {
        do {
          ptVar5 = ptVar6->parent;
          bVar7 = ptVar5->right == ptVar6;
          ptVar6 = ptVar5;
        } while (bVar7);
      }
      else {
        do {
          ptVar5 = ptVar3;
          ptVar3 = ptVar5->left;
        } while (ptVar5->left != ptVar1);
      }
    } while (ptVar5 != (t->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
                       super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.
                       m_last);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}